

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O3

void __thiscall MetaDCEGraph::scanWebAssembly(MetaDCEGraph *this)

{
  pointer *ppNVar1;
  Export *__k;
  Export *pEVar2;
  long lVar3;
  pointer pNVar4;
  pointer pNVar5;
  iterator __position;
  pointer puVar6;
  Global *pGVar7;
  pointer puVar8;
  ElementSegment *segment_00;
  pointer puVar9;
  DataSegment *pDVar10;
  undefined1 auVar11 [8];
  size_t sVar12;
  __node_base_ptr p_Var13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  pointer puVar16;
  mapped_type *pmVar17;
  __hashtable *__h;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar18;
  pointer puVar19;
  pointer puVar20;
  pointer puVar21;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_398;
  Module *local_390;
  MixedArena *local_388;
  undefined8 local_380;
  undefined1 uStack_378;
  undefined7 uStack_377;
  undefined1 uStack_370;
  undefined8 uStack_36f;
  undefined2 local_367;
  undefined8 local_364;
  undefined8 uStack_35c;
  undefined4 local_354;
  undefined1 local_350;
  undefined5 local_34c;
  undefined3 uStack_347;
  undefined5 uStack_344;
  undefined1 local_330;
  undefined1 local_328;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined4 local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined2 local_2b0;
  Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> local_2a8;
  MetaDCEGraph *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 auStack_1b8 [8];
  Name dceName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [3];
  bool local_168;
  Expression **local_160;
  TaskFunc p_Stack_158;
  pointer local_108;
  pointer pTStack_100;
  pointer local_f8;
  Function *pFStack_f0;
  Module *local_e8;
  MetaDCEGraph *local_e0;
  Expression **local_d8;
  TaskFunc p_Stack_d0;
  pointer local_b0;
  pointer pTStack_a8;
  pointer local_a0;
  Function *pFStack_98;
  Module *local_90;
  MetaDCEGraph *local_88;
  pointer local_80;
  string local_78;
  string local_58;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_38;
  
  wasm::ModuleUtils::
  iterModuleItems<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::ModuleItemKind,wasm::Named*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  local_390 = this->wasm;
  puVar18 = (local_390->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar16 = (local_390->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar18 != puVar16) {
    local_38 = &(this->exportToDCENode)._M_h;
    local_80 = puVar16;
    do {
      __k = (puVar18->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
            super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (__k[0x28] == (Export)0x0) {
        p_Var13 = std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            (local_38,(ulong)*(char **)(__k + 8) %
                                      (this->exportToDCENode)._M_h._M_bucket_count,(key_type *)__k,
                             (__hash_code)*(char **)(__k + 8));
        if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0)) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"export","");
          pEVar2 = (puVar18->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          lVar3 = *(long *)(pEVar2 + 8);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,lVar3,*(long *)pEVar2 + lVar3);
          _auStack_1b8 = (string_view)getName(this,&local_78,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          pmVar14 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_38,
                                 (key_type *)
                                 (puVar18->_M_t).
                                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
          auVar11 = auStack_1b8;
          sVar12 = dceName.super_IString.str._M_len;
          (pmVar14->super_IString).str._M_len = (size_t)auStack_1b8;
          (pmVar14->super_IString).str._M_str = (char *)dceName.super_IString.str._M_len;
          pmVar15 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this,(key_type *)auStack_1b8);
          (pmVar15->name).super_IString.str._M_len = (size_t)auVar11;
          (pmVar15->name).super_IString.str._M_str = (char *)sVar12;
          pNVar4 = (pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pNVar5 = (pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (pNVar4 != (pointer)0x0) {
            operator_delete(pNVar4,(long)pNVar5 - (long)pNVar4);
          }
        }
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_38,
                               (key_type *)
                               (puVar18->_M_t).
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        pmVar15 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,pmVar14);
        _auStack_1b8 = (string_view)
                       getDCEName(this,*(ModuleItemKind *)
                                        ((puVar18->_M_t).
                                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                         .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                        + 0x10),(IString)*(IString *)(__k + 0x18));
        __position._M_current =
             (pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                    (&pmVar15->reaches,__position,(Name *)auStack_1b8);
          puVar16 = local_80;
        }
        else {
          *(undefined4 *)&((__position._M_current)->super_IString).str._M_len = auStack_1b8._0_4_;
          *(undefined4 *)((long)&((__position._M_current)->super_IString).str._M_len + 4) =
               auStack_1b8._4_4_;
          *(undefined4 *)&((__position._M_current)->super_IString).str._M_str =
               (undefined4)dceName.super_IString.str._M_len;
          *(undefined4 *)((long)&((__position._M_current)->super_IString).str._M_str + 4) =
               dceName.super_IString.str._M_len._4_4_;
          ppNVar1 = &(pmVar15->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppNVar1 = *ppNVar1 + 1;
          puVar16 = local_80;
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar16);
    local_390 = this->wasm;
  }
  puVar19 = (local_390->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (local_390->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar6) {
    do {
      pGVar7 = (puVar19->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar7->super_Importable).module + 8) == (char *)0x0) {
        local_2a8.replacep = (Expression **)CONCAT44(local_2a8.replacep._4_4_,3);
        local_2a8.stack.usedFixed = *(size_t *)&(pGVar7->super_Importable).super_Named;
        local_2a8.stack.fixed._M_elems[0].func =
             *(TaskFunc *)((long)&(pGVar7->super_Importable).super_Named + 8);
        pmVar17 = std::__detail::
                  _Map_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->itemToDCENode,(key_type *)&local_2a8);
        local_d8 = (Expression **)(pmVar17->super_IString).str._M_len;
        p_Stack_d0 = (TaskFunc)(pmVar17->super_IString).str._M_str;
        _auStack_1b8 = (string_view)ZEXT816(0);
        local_f8 = (pointer)0x0;
        pFStack_f0 = (Function *)0x0;
        local_108 = (pointer)0x0;
        pTStack_100 = (pointer)0x0;
        local_e8 = this->wasm;
        local_e0 = this;
        wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::walk
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)auStack_1b8,
                   &pGVar7->init);
        if (local_108 != (pointer)0x0) {
          operator_delete(local_108,(long)local_f8 - (long)local_108);
        }
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar6);
    local_390 = this->wasm;
  }
  local_2a8.replacep = (Expression **)0x0;
  local_2a8.stack.usedFixed = 0;
  local_2a8.stack.flexible.
  super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.stack.flexible.
  super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.stack.flexible.
  super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.currFunction = (Function *)0x0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  dceName.super_IString.str._M_len = (size_t)&local_2a8;
  auStack_1b8 = (undefined1  [8])this;
  puVar20 = (local_390->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (local_390->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2a8.currModule = local_390;
  local_1d0 = this;
  if (puVar20 != puVar8) {
    do {
      segment_00 = (puVar20->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(long *)(segment_00 + 0x20) != 0) {
        scanWebAssembly::anon_class_16_2_51b3ad0a::operator()
                  ((anon_class_16_2_51b3ad0a *)auStack_1b8,segment_00);
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar8);
    local_390 = this->wasm;
  }
  puVar21 = (local_390->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (local_390->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar21 != puVar9) {
    do {
      pDVar10 = (puVar21->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar10->isPassive == false) {
        wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::walk
                  (&local_2a8,&pDVar10->offset);
        _auStack_1b8 = (string_view)
                       getDCEName(this,DataSegment,
                                  (IString)(pDVar10->super_Named).name.super_IString);
        local_398 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     *)&this->roots;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&this->roots,auStack_1b8,&local_398);
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar9);
    local_390 = this->wasm;
  }
  local_320 = &uStack_2f0;
  local_398 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)std::_Rb_tree_increment;
  local_388 = &local_390->allocator;
  local_380 = 0;
  uStack_378 = 0;
  uStack_377 = 0;
  uStack_370 = 0;
  uStack_36f = 0;
  local_367 = 0x101;
  local_364 = 0;
  uStack_35c = 0xffffffff00000002;
  local_354 = 0x14;
  local_350 = 0;
  local_330 = 0;
  local_328 = 0;
  local_34c = 0;
  uStack_347 = 0;
  uStack_344 = 0;
  local_318 = 1;
  local_310 = 0;
  uStack_308 = 0;
  local_300 = 0x3f800000;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = &uStack_2b8;
  local_2e0 = 1;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2c8 = 0x3f800000;
  local_2c0 = 0;
  uStack_2b8 = 0;
  local_2b0 = 0;
  dceName.super_IString.str._M_str = (char *)local_198;
  local_198[0]._M_local_buf[0] = '\0';
  local_168 = false;
  local_160 = (Expression **)0x0;
  p_Stack_158 = (TaskFunc)0x0;
  local_b0 = (pointer)0x0;
  pTStack_a8 = (pointer)0x0;
  local_a0 = (pointer)0x0;
  pFStack_98 = (Function *)0x0;
  local_90 = (Module *)0x0;
  _auStack_1b8 = (string_view)ZEXT816(0x136cc0);
  local_88 = this;
  wasm::WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
              *)auStack_1b8,(PassRunner *)&local_398,local_390);
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0,(long)local_a0 - (long)local_b0);
  }
  wasm::Pass::~Pass((Pass *)auStack_1b8);
  wasm::PassRunner::~PassRunner((PassRunner *)&local_398);
  if (local_2a8.stack.flexible.
      super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.stack.flexible.
                    super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.stack.flexible.
                          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.stack.flexible.
                          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void scanWebAssembly() {
    // Add an entry for everything we might need ahead of time, so parallel work
    // does not alter parent state, just adds to things pointed by it,
    // independently (each thread will add for one function, etc.)
    ModuleUtils::iterModuleItems(wasm, [&](ModuleItemKind kind, Named* item) {
      if (auto* import = wasm.getImportOrNull(kind, item->name)) {
        auto id = getImportId(import->module, import->base);
        if (importIdToDCENode.find(id) == importIdToDCENode.end()) {
          auto dceName = getName("importId", import->name.toString());
          importIdToDCENode[id] = dceName;
        }
        return;
      }
      auto dceName = getName(kindPrefixes[kind], item->name.toString());
      itemToDCENode[{kind, item->name}] = dceName;
      nodes[dceName] = DCENode(dceName);
    });
    for (auto& exp : wasm.exports) {
      // skip type exports
      // TODO: shall we keep track of type dependencies?
      if (auto* name = exp->getInternalName()) {
        if (exportToDCENode.find(exp->name) == exportToDCENode.end()) {
          auto dceName = getName("export", exp->name.toString());
          exportToDCENode[exp->name] = dceName;
          nodes[dceName] = DCENode(dceName);
        }
        // we can also link the export to the thing being exported
        auto& node = nodes[exportToDCENode[exp->name]];
        node.reaches.push_back(getDCEName(ModuleItemKind(exp->kind), *name));
      }
    }
    // Add initializer dependencies
    // if we provide a parent DCE name, that is who can reach what we see
    // if none is provided, then it is something we must root
    struct InitScanner : public PostWalker<InitScanner> {
      InitScanner(MetaDCEGraph* parent, Name parentDceName)
        : parent(parent), parentDceName(parentDceName) {}

      void visitGlobalGet(GlobalGet* curr) { handleGlobal(curr->name); }
      void visitGlobalSet(GlobalSet* curr) { handleGlobal(curr->name); }
      void visitRefFunc(RefFunc* curr) {
        assert(!parentDceName.isNull());
        parent->nodes[parentDceName].reaches.push_back(
          parent->getDCEName(ModuleItemKind::Function, curr->func));
      }

    private:
      MetaDCEGraph* parent;
      Name parentDceName;

      void handleGlobal(Name name) {
        Name dceName;
        if (!getModule()->getGlobal(name)->imported()) {
          // its a defined global
          dceName = parent->itemToDCENode[{ModuleItemKind::Global, name}];
        } else {
          // it's an import.
          dceName = parent->importIdToDCENode[parent->getImportId(
            ModuleItemKind::Global, name)];
        }
        if (parentDceName.isNull()) {
          parent->roots.insert(dceName);
        } else {
          parent->nodes[parentDceName].reaches.push_back(dceName);
        }
      }
    };
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      InitScanner scanner(
        this, itemToDCENode[{ModuleItemKind::Global, global->name}]);
      scanner.setModule(&wasm);
      scanner.walk(global->init);
    });
    // We can't remove active segments, so root them and what they use.
    // TODO: treat them as in a cycle with their parent memory/table
    InitScanner rooter(this, Name());
    rooter.setModule(&wasm);
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      // TODO: currently, all functions in the table are roots, but we
      //       should add an option to refine that
      ElementUtils::iterElementSegmentFunctionNames(
        segment, [&](Name name, Index) {
          roots.insert(getDCEName(ModuleItemKind::Function, name));
        });
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::ElementSegment, segment->name));
    });
    ModuleUtils::iterActiveDataSegments(wasm, [&](DataSegment* segment) {
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::DataSegment, segment->name));
    });

    // A parallel scanner for function bodies
    struct Scanner : public WalkerPass<
                       PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>>> {
      bool isFunctionParallel() override { return true; }

      Scanner(MetaDCEGraph* parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Scanner>(parent);
      }

      void visitExpression(Expression* curr) {
#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#define DELEGATE_FIELD_NAME_KIND(id, field, kind)                              \
  if (cast->field.is()) {                                                      \
    handle(kind, cast->field);                                                 \
  }

#include "wasm-delegations-fields.def"
      }

    private:
      MetaDCEGraph* parent;

      void handle(ModuleItemKind kind, Name name) {
        getCurrentFunctionDCENode().reaches.push_back(
          parent->getDCEName(kind, name));
      }

      DCENode& getCurrentFunctionDCENode() {
        return parent->nodes[parent->itemToDCENode[{ModuleItemKind::Function,
                                                    getFunction()->name}]];
      }
    };

    PassRunner runner(&wasm);
    Scanner(this).run(&runner, &wasm);
  }